

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

int32 __thiscall
rw::PluginList::registerPlugin
          (PluginList *this,int32 size,uint32 id,Constructor ctor,Destructor dtor,
          CopyConstructor copy)

{
  int iVar1;
  int *piVar2;
  code *pcVar3;
  code *pcVar4;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/plg.cpp line: 171";
  piVar2 = (int *)(*Engine::memfuncs)(0x78,0x40000);
  iVar1 = this->size;
  *piVar2 = iVar1;
  this->size = iVar1 + size + 7U & 0xfffffff8;
  piVar2[1] = size;
  piVar2[2] = id;
  pcVar3 = defCtor;
  if (ctor != (Constructor)0x0) {
    pcVar3 = ctor;
  }
  pcVar4 = defDtor;
  if (dtor != (Destructor)0x0) {
    pcVar4 = dtor;
  }
  *(code **)(piVar2 + 4) = pcVar3;
  *(code **)(piVar2 + 6) = pcVar4;
  pcVar3 = defCopy;
  if (copy != (CopyConstructor)0x0) {
    pcVar3 = copy;
  }
  *(code **)(piVar2 + 8) = pcVar3;
  piVar2[10] = 0;
  piVar2[0xb] = 0;
  piVar2[0xc] = 0;
  piVar2[0xd] = 0;
  piVar2[0xe] = 0;
  piVar2[0xf] = 0;
  piVar2[0x10] = 0;
  piVar2[0x11] = 0;
  piVar2[0x12] = 0;
  piVar2[0x13] = 0;
  *(PluginList **)(piVar2 + 0x14) = this;
  *(LinkList **)(piVar2 + 0x16) = &this->plugins;
  *(LLLink **)(piVar2 + 0x18) = (this->plugins).link.prev;
  ((this->plugins).link.prev)->next = (LLLink *)(piVar2 + 0x16);
  (this->plugins).link.prev = (LLLink *)(piVar2 + 0x16);
  *(undefined8 **)(piVar2 + 0x1a) = &allPlugins;
  *(long **)(piVar2 + 0x1c) = DAT_0014a158;
  *DAT_0014a158 = (long)(piVar2 + 0x1a);
  DAT_0014a158 = (long *)(piVar2 + 0x1a);
  return iVar1;
}

Assistant:

int32
PluginList::registerPlugin(int32 size, uint32 id,
	Constructor ctor, Destructor dtor, CopyConstructor copy)
{
	Plugin *p = (Plugin*)rwMalloc(sizeof(Plugin), MEMDUR_GLOBAL);
	p->offset = this->size;
	this->size += size;
	int32 round = sizeof(void*)-1;
	this->size = (this->size + round)&~round;

	p->size = size;
	p->id = id;
	p->constructor = ctor ? ctor : defCtor;
	p->destructor = dtor ? dtor : defDtor;
	p->copy = copy ? copy : defCopy;
	p->read = nil;
	p->write = nil;
	p->getSize = nil;
	p->rightsCallback = nil;
	p->alwaysCallback = nil;
	p->parentList = this;
	this->plugins.append(&p->inParentList);
	allPlugins.append(&p->inGlobalList);
	return p->offset;
}